

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_0U>::overlap_iterator::treeFindUnion
          (overlap_iterator *this)

{
  uint uVar1;
  pointer pEVar2;
  ulong uVar3;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *pSVar4;
  NodeRef NVar5;
  PointerIntPair<void_*,_6U,_6U,_unsigned_int> PVar6;
  long *plVar7;
  ulong uVar8;
  int iVar9;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *pSVar10;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this_00;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *pSVar11;
  ulong unaff_R12;
  ulong uVar12;
  uint uVar13;
  BranchNode<unsigned_long,_8U,_false> *self;
  ulong uVar14;
  bool bVar15;
  uint local_44;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *local_40;
  NodeRef local_38;
  
  if (((this->super_iterator).super_const_iterator.path.path.
       super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len != 0) &&
     (pEVar2 = (this->super_iterator).super_const_iterator.path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_,
     pEVar2->offset < pEVar2->size)) {
    iVar9 = (int)(this->super_iterator).super_const_iterator.path.path.
                 super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
    uVar1 = iVar9 - 1;
    pEVar2 = (this->super_iterator).super_const_iterator.path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    pSVar11 = (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)(ulong)pEVar2[uVar1].offset
    ;
    local_40 = (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)
               &(this->super_iterator).super_const_iterator.path;
    PVar6.value = *(ulong *)((long)pEVar2[uVar1].node + (long)pSVar11 * 8);
    NVar5.pip.value = local_38.pip.value;
    uVar1 = local_44;
    for (iVar9 = ((this->super_iterator).super_const_iterator.map)->height - iVar9;
        local_38.pip.value =
             (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)
             (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)PVar6.value, this_00 = local_40,
        local_40 = this_00, iVar9 != 0; iVar9 = iVar9 + -1) {
      uVar13 = (SUB84(local_38.pip.value,0) & 0x3f) + 1;
      uVar14 = (ulong)local_38.pip.value & 0xffffffffffffffc0;
      uVar3 = (this->searchKey).left;
      plVar7 = (long *)(uVar14 + 0x48);
      uVar8 = 0;
      do {
        if ((ulong)plVar7[-1] < uVar3) {
          bVar15 = *plVar7 + 1U < uVar3;
          if (!bVar15) {
            unaff_R12 = uVar8;
          }
        }
        else {
          bVar15 = false;
          unaff_R12 = uVar8;
        }
        unaff_R12 = unaff_R12 & 0xffffffff;
        uVar12 = unaff_R12;
        if (!bVar15) break;
        uVar8 = uVar8 + 1;
        plVar7 = plVar7 + 2;
        uVar12 = (ulong)uVar13;
      } while (uVar13 != uVar8);
      local_44 = (uint)uVar12;
      if (local_44 == uVar13) {
        local_44 = uVar1;
        local_38.pip.value = NVar5.pip.value;
        const_iterator::setRoot
                  ((const_iterator *)this,
                   ((this->super_iterator).super_const_iterator.map)->rootSize);
        return;
      }
      SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
      emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>(this_00,&local_38,&local_44);
      PVar6.value = *(ulong *)(uVar14 + uVar12 * 8);
      pSVar11 = this_00;
      unaff_R12 = uVar12;
      NVar5.pip.value = local_38.pip.value;
      uVar1 = local_44;
    }
    uVar13 = (SUB84(local_38.pip.value,0) & 0x3f) + 1;
    uVar3 = (this->searchKey).left;
    plVar7 = (long *)((ulong)local_38.pip.value & 0xffffffffffffffc0 | 8);
    pSVar10 = (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)0x0;
    do {
      if ((ulong)plVar7[-1] < uVar3) {
        bVar15 = *plVar7 + 1U < uVar3;
        pSVar4 = pSVar11;
        if (!bVar15) {
          pSVar4 = pSVar10;
        }
      }
      else {
        bVar15 = false;
        pSVar4 = pSVar10;
      }
      pSVar11 = (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)
                ((ulong)pSVar4 & 0xffffffff);
      local_44 = (uint)pSVar4;
      if (!bVar15) break;
      pSVar10 = (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)
                ((long)&pSVar10->data_ + 1);
      plVar7 = plVar7 + 2;
      local_44 = uVar13;
    } while ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)(ulong)uVar13 != pSVar10);
    if (local_44 == uVar13) {
      local_44 = uVar1;
      local_38.pip.value = NVar5.pip.value;
      const_iterator::setRoot
                ((const_iterator *)this,((this->super_iterator).super_const_iterator.map)->rootSize)
      ;
    }
    else {
      SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
      emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>(this_00,&local_38,&local_44);
    }
  }
  return;
}

Assistant:

[[nodiscard]] constexpr bool empty() const noexcept { return len == 0; }